

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void sha256_str(SHA256_DIGEST digest,char *str,size_t max_len)

{
  size_t sVar1;
  ulong uVar2;
  byte bVar3;
  
  sVar1 = 0x41;
  if (max_len < 0x41) {
    sVar1 = max_len;
  }
  str[sVar1 - 1] = '\0';
  if (sVar1 != 1) {
    uVar2 = 0;
    do {
      bVar3 = digest.data[uVar2 >> 1 & 0x7fffffff] & 0xf;
      if ((uVar2 & 1) == 0) {
        bVar3 = digest.data[uVar2 >> 1 & 0x7fffffff] >> 4;
      }
      str[uVar2] = "0123456789abcdef"[bVar3];
      uVar2 = uVar2 + 1;
    } while ((uVar2 & 0xffffffff) < sVar1 - 1);
  }
  return;
}

Assistant:

static void digest_str(const unsigned char *digest, size_t digest_len, char *str, size_t max_len)
{
	unsigned i;
	if(max_len > digest_len * 2 + 1)
	{
		max_len = digest_len * 2 + 1;
	}
	str[max_len - 1] = 0;
	max_len -= 1;
	for(i = 0; i < max_len; i++)
	{
		static const char HEX[] = "0123456789abcdef";
		int index = i / 2;
		if(i % 2 == 0)
		{
			str[i] = HEX[digest[index] >> 4];
		}
		else
		{
			str[i] = HEX[digest[index] & 0xf];
		}
	}
}